

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_assertion_tests.cpp
# Opt level: O2

void same_stl_string_reference_and_pointer_are_equal(void)

{
  string *this;
  Constraint_ *pCVar1;
  allocator local_31;
  string alice_reference;
  
  this = (string *)operator_new(0x20);
  std::__cxx11::string::string((string *)this,"alice",(allocator *)&alice_reference);
  alice_pointer_abi_cxx11_ = this;
  std::__cxx11::string::string((string *)&alice_reference,"alice",&local_31);
  pCVar1 = (Constraint_ *)
           cgreen::create_equal_to_string_constraint
                     ((string *)alice_pointer_abi_cxx11_,"alice_pointer");
  cgreen::assert_that_
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/cpp_assertion_tests.cpp"
             ,0x99,"alice_reference",(string *)&alice_reference,pCVar1);
  std::__cxx11::string::~string((string *)&alice_reference);
  return;
}

Assistant:

Ensure(same_stl_string_reference_and_pointer_are_equal) {
    alice_pointer = new std::string("alice");
    std::string alice_reference("alice");

    assert_that(alice_reference, is_equal_to_string(alice_pointer));
}